

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall cubeb_resampler_delay_line_Test::TestBody(cubeb_resampler_delay_line_Test *this)

{
  uint32_t channel;
  uint channels;
  uint32_t delay_frames;
  uint delay_frames_00;
  uint32_t chunk_size;
  uint32_t chunk_ms;
  ulong uVar1;
  
  for (channels = 1; channels != 3; channels = channels + 1) {
    for (delay_frames_00 = 4; delay_frames_00 < 0x29; delay_frames_00 = delay_frames_00 + 10) {
      uVar1 = 10;
      while (chunk_ms = (uint32_t)uVar1, chunk_ms != 0x1f) {
        fprintf(_stderr,"channel: %d, delay_frames: %d, chunk_size: %d\n",(ulong)channels,
                (ulong)delay_frames_00,uVar1);
        test_delay_lines(delay_frames_00,channels,chunk_ms);
        uVar1 = (ulong)(chunk_ms + 1);
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, resampler_delay_line)
{
  for (uint32_t channel = 1; channel <= 2; channel++) {
    for (uint32_t delay_frames = 4; delay_frames <= 40;
         delay_frames += chunk_increment) {
      for (uint32_t chunk_size = 10; chunk_size <= 30; chunk_size++) {
        fprintf(stderr, "channel: %d, delay_frames: %d, chunk_size: %d\n",
                channel, delay_frames, chunk_size);
        test_delay_lines(delay_frames, channel, chunk_size);
      }
    }
  }
}